

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O1

void ssh2_bpp_format_packet_inner(ssh2_bpp_state *s,PktOut *pkt)

{
  size_t sVar1;
  uchar *puVar2;
  PacketLogSettings *pPVar3;
  LogContext *ctx;
  ssh_cipher *psVar4;
  ssh_compressor *psVar5;
  ssh2_mac *psVar6;
  DataTransferStats *pDVar7;
  int iVar8;
  uint8_t *p;
  char *texttype;
  ulong uVar9;
  unsigned_long uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  size_t len;
  ptrlen pkt_00;
  size_t local_78;
  int newlen;
  logblank_t blanks [4];
  
  if ((s->bpp).logctx != (LogContext *)0x0) {
    sVar1 = pkt->prefix;
    puVar2 = pkt->data;
    len = pkt->length - sVar1;
    pkt_00.len = len;
    pkt_00.ptr = puVar2 + sVar1;
    iVar8 = ssh2_censor_packet((s->bpp).pls,pkt->type,true,pkt_00,blanks);
    pPVar3 = (s->bpp).pls;
    ctx = (s->bpp).logctx;
    iVar13 = pkt->type;
    texttype = ssh2_pkt_type(pPVar3->kctx,pPVar3->actx,iVar13);
    log_packet(ctx,1,iVar13,texttype,puVar2 + sVar1,len,iVar8,blanks,&(s->out).sequence,
               pkt->downstream_id,pkt->additional_log_text);
  }
  psVar4 = (s->out).cipher;
  uVar15 = 8;
  if (psVar4 != (ssh_cipher *)0x0) {
    uVar15 = psVar4->vt->blksize;
  }
  uVar11 = 8;
  if (8 < (int)uVar15) {
    uVar11 = uVar15;
  }
  psVar5 = s->out_comp;
  if (psVar5 != (ssh_compressor *)0x0) {
    iVar13 = (int)pkt->minlen;
    if (iVar13 == 0) {
      iVar13 = 0;
    }
    else {
      psVar6 = (s->out).mac;
      if (psVar6 != (ssh2_mac *)0x0) {
        iVar13 = iVar13 - psVar6->vt->len;
      }
      iVar13 = iVar13 + -8;
    }
    (*psVar5->vt->compress)
              (psVar5,pkt->data + 5,(int)pkt->length + -5,(uchar **)blanks,&newlen,iVar13);
    pkt->length = 5;
    BinarySink_put_data(pkt->binarysink_,(void *)blanks[0]._0_8_,(long)newlen);
    safefree((void *)blanks[0]._0_8_);
  }
  psVar6 = (s->out).mac;
  if (psVar6 == (ssh2_mac *)0x0) {
    uVar9 = 4;
  }
  else {
    uVar9 = (ulong)(((s->out).etm_mode ^ 1) << 2);
  }
  uVar12 = (ulong)uVar11;
  sVar1 = pkt->length;
  iVar13 = (int)((uVar12 - (uVar9 + sVar1) % uVar12) % uVar12);
  iVar8 = iVar13 + 4;
  if (0xff < iVar8) {
    __assert_fail("padding <= 255",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp2.c",
                  0x318,"void ssh2_bpp_format_packet_inner(struct ssh2_bpp_state *, PktOut *)");
  }
  if (psVar6 == (ssh2_mac *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = (size_t)psVar6->vt->len;
  }
  if (0 < iVar8) {
    iVar14 = 0;
    do {
      BinarySink_put_byte(pkt->binarysink_,'\0');
      iVar14 = iVar14 + 1;
    } while (iVar14 < iVar8);
  }
  iVar14 = (int)sVar1;
  random_read(pkt->data + iVar14,(long)iVar8);
  pkt->data[4] = (uchar)iVar8;
  uVar15 = iVar13 + iVar14;
  *(uint *)pkt->data =
       uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 * 0x1000000;
  psVar4 = (s->out).cipher;
  if ((psVar4 != (ssh_cipher *)0x0) && ((psVar4->vt->flags & 2) != 0)) {
    (*psVar4->vt->encrypt_length)(psVar4,pkt->data,4,(s->out).sequence);
  }
  iVar8 = iVar8 + iVar14;
  BinarySink_put_padding(pkt->binarysink_,local_78,'\0');
  psVar6 = (s->out).mac;
  if (psVar6 != (ssh2_mac *)0x0) {
    if ((s->out).etm_mode == true) {
      psVar4 = (s->out).cipher;
      if (psVar4 != (ssh_cipher *)0x0) {
        (*psVar4->vt->encrypt)(psVar4,pkt->data + 4,uVar15);
      }
      ssh2_mac_generate((s->out).mac,pkt->data,iVar8,(s->out).sequence);
      goto LAB_0011e225;
    }
    if (psVar6 != (ssh2_mac *)0x0) {
      ssh2_mac_generate(psVar6,pkt->data,iVar8,(s->out).sequence);
    }
  }
  psVar4 = (s->out).cipher;
  if (psVar4 != (ssh_cipher *)0x0) {
    (*psVar4->vt->encrypt)(psVar4,pkt->data,iVar8);
  }
LAB_0011e225:
  (s->out).sequence = (s->out).sequence + 1;
  pDVar7 = s->stats;
  if ((pDVar7->out).running == true) {
    uVar9 = (pDVar7->out).remaining;
    uVar10 = uVar9 - (long)iVar8;
    if (uVar9 < (ulong)(long)iVar8 || uVar10 == 0) {
      (pDVar7->out).running = false;
      (pDVar7->out).expired = true;
    }
    else {
      (pDVar7->out).remaining = uVar10;
    }
  }
  return;
}

Assistant:

static void ssh2_bpp_format_packet_inner(struct ssh2_bpp_state *s, PktOut *pkt)
{
    int origlen, cipherblk, maclen, padding, unencrypted_prefix, i;

    if (s->bpp.logctx) {
        ptrlen pktdata = make_ptrlen(pkt->data + pkt->prefix,
                                     pkt->length - pkt->prefix);
        logblank_t blanks[MAX_BLANKS];
        int nblanks = ssh2_censor_packet(
            s->bpp.pls, pkt->type, true, pktdata, blanks);
        log_packet(s->bpp.logctx, PKT_OUTGOING, pkt->type,
                   ssh2_pkt_type(s->bpp.pls->kctx, s->bpp.pls->actx,
                                 pkt->type),
                   pktdata.ptr, pktdata.len, nblanks, blanks, &s->out.sequence,
                   pkt->downstream_id, pkt->additional_log_text);
    }

    cipherblk = s->out.cipher ? ssh_cipher_alg(s->out.cipher)->blksize : 8;
    cipherblk = cipherblk < 8 ? 8 : cipherblk;  /* or 8 if blksize < 8 */

    if (s->out_comp) {
        unsigned char *newpayload;
        int minlen, newlen;

        /*
         * Compress packet payload.
         */
        minlen = pkt->minlen;
        if (minlen) {
            /*
             * Work out how much compressed data we need (at least) to
             * make the overall packet length come to pkt->minlen.
             */
            if (s->out.mac)
                minlen -= ssh2_mac_alg(s->out.mac)->len;
            minlen -= 8;              /* length field + min padding */
        }

        ssh_compressor_compress(s->out_comp, pkt->data + 5, pkt->length - 5,
                                &newpayload, &newlen, minlen);
        pkt->length = 5;
        put_data(pkt, newpayload, newlen);
        sfree(newpayload);
    }

    /*
     * Add padding. At least four bytes, and must also bring total
     * length (minus MAC) up to a multiple of the block size.
     * If pkt->forcepad is set, make sure the packet is at least that size
     * after padding.
     */
    padding = 4;
    unencrypted_prefix = (s->out.mac && s->out.etm_mode) ? 4 : 0;
    padding +=
        (cipherblk - (pkt->length - unencrypted_prefix + padding) % cipherblk)
        % cipherblk;
    assert(padding <= 255);
    maclen = s->out.mac ? ssh2_mac_alg(s->out.mac)->len : 0;
    origlen = pkt->length;
    for (i = 0; i < padding; i++)
        put_byte(pkt, 0);              /* make space for random padding */
    random_read(pkt->data + origlen, padding);
    pkt->data[4] = padding;
    PUT_32BIT_MSB_FIRST(pkt->data, origlen + padding - 4);

    /* Encrypt length if the scheme requires it */
    if (s->out.cipher &&
        (ssh_cipher_alg(s->out.cipher)->flags & SSH_CIPHER_SEPARATE_LENGTH)) {
        ssh_cipher_encrypt_length(s->out.cipher, pkt->data, 4,
                                  s->out.sequence);
    }

    put_padding(pkt, maclen, 0);

    if (s->out.mac && s->out.etm_mode) {
        /*
         * OpenSSH-defined encrypt-then-MAC protocol.
         */
        if (s->out.cipher)
            ssh_cipher_encrypt(s->out.cipher,
                               pkt->data + 4, origlen + padding - 4);
        ssh2_mac_generate(s->out.mac, pkt->data, origlen + padding,
                          s->out.sequence);
    } else {
        /*
         * SSH-2 standard protocol.
         */
        if (s->out.mac)
            ssh2_mac_generate(s->out.mac, pkt->data, origlen + padding,
                              s->out.sequence);
        if (s->out.cipher)
            ssh_cipher_encrypt(s->out.cipher, pkt->data, origlen + padding);
    }

    s->out.sequence++;       /* whether or not we MACed */

    dts_consume(&s->stats->out, origlen + padding);
}